

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O0

void x86_64_branch_link(dill_stream s)

{
  private_ctx pdVar1;
  char *pcVar2;
  int tmp;
  int offset;
  char *branch_addr;
  int label_offset;
  int label;
  int i;
  branch_table *t;
  dill_stream s_local;
  
  pdVar1 = s->p;
  for (i = 0; i < (pdVar1->branch_table).branch_count; i = i + 1) {
    pcVar2 = s->p->code_base + (pdVar1->branch_table).branch_locs[i].loc;
    if (*pcVar2 == '\x0f') {
      branch_addr = pcVar2 + 2;
      offset = 6;
    }
    else {
      branch_addr = pcVar2 + 1;
      offset = 5;
    }
    *(int *)branch_addr =
         ((pdVar1->branch_table).label_locs[(pdVar1->branch_table).branch_locs[i].label] -
         (pdVar1->branch_table).branch_locs[i].loc) - offset;
  }
  return;
}

Assistant:

static void
x86_64_branch_link(dill_stream s)
{
    struct branch_table* t = &s->p->branch_table;
    int i;

    for (i = 0; i < t->branch_count; i++) {
        int label = t->branch_locs[i].label;
        int label_offset = t->label_locs[label] - t->branch_locs[i].loc;
        char* branch_addr =
            (char*)((char*)s->p->code_base + t->branch_locs[i].loc);
        int offset;
        if (*branch_addr == 0x0f) {
            branch_addr += 2; /* conditional */
            offset = 6;
        } else {
            branch_addr++; /* unconditional */
            offset = 5;
        }
        int tmp = label_offset - offset;
        memcpy(branch_addr, &tmp, 4);
    }
}